

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_ringbuffer.h
# Opt level: O0

int __thiscall
ring_buffer_base<cubeb_log_message>::dequeue
          (ring_buffer_base<cubeb_log_message> *this,cubeb_log_message *elements,int count)

{
  bool bVar1;
  atomic<int> *paVar2;
  int *piVar3;
  cubeb_log_message *in_RSI;
  ring_buffer_base<cubeb_log_message> *in_RDI;
  int second_part;
  int first_part;
  int to_read;
  int rd_idx;
  int wr_idx;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  undefined8 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  ring_buffer_base<cubeb_log_message> *in_stack_ffffffffffffff48;
  cubeb_log_message *source;
  cubeb_log_message *in_stack_ffffffffffffff50;
  cubeb_log_message *destination;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  __int_type local_68;
  int local_64;
  cubeb_log_message *local_60;
  int local_4c;
  int local_40;
  int local_3c;
  int local_2c;
  memory_order local_28;
  int local_24;
  __int_type local_14;
  memory_order local_10;
  int local_c;
  atomic<int> *local_8;
  
  paVar2 = &in_RDI->write_index_;
  local_c = 2;
  local_60 = in_RSI;
  local_8 = paVar2;
  local_10 = std::operator&(memory_order_acquire,__memory_order_mask);
  if (local_c - 1U < 2) {
    local_14 = (paVar2->super___atomic_base<int>)._M_i;
  }
  else if (local_c == 5) {
    local_14 = (paVar2->super___atomic_base<int>)._M_i;
  }
  else {
    local_14 = (paVar2->super___atomic_base<int>)._M_i;
  }
  local_68 = local_14;
  local_24 = 0;
  local_28 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_24 - 1U < 2) {
    local_2c = (in_RDI->read_index_).super___atomic_base<int>._M_i;
  }
  else if (local_24 == 5) {
    local_2c = (in_RDI->read_index_).super___atomic_base<int>._M_i;
  }
  else {
    local_2c = (in_RDI->read_index_).super___atomic_base<int>._M_i;
  }
  local_6c = local_2c;
  bVar1 = empty_internal(in_RDI,local_2c,local_68);
  if (bVar1) {
    local_4c = 0;
  }
  else {
    local_74 = available_read_internal
                         (in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                          in_stack_ffffffffffffff40);
    piVar3 = std::min<int>(&local_74,&local_64);
    local_70 = *piVar3;
    local_7c = storage_capacity(in_RDI);
    local_7c = local_7c - local_6c;
    piVar3 = std::min<int>(&local_7c,&local_70);
    local_78 = *piVar3;
    if (local_60 != (cubeb_log_message *)0x0) {
      source = local_60;
      std::unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_>::get
                ((unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_> *)
                 0x10b7eb);
      Copy<cubeb_log_message>
                (in_stack_ffffffffffffff50,source,
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      destination = local_60 + local_78;
      std::unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_>::get
                ((unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_> *)
                 0x10b82d);
      Copy<cubeb_log_message>
                (destination,source,CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    }
    local_3c = increment_index((ring_buffer_base<cubeb_log_message> *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                               (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                               (int)in_stack_ffffffffffffff38);
    local_40 = 0;
    std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_40 == 3) {
      (in_RDI->read_index_).super___atomic_base<int>._M_i = local_3c;
    }
    else if (local_40 == 5) {
      LOCK();
      (in_RDI->read_index_).super___atomic_base<int>._M_i = local_3c;
      UNLOCK();
    }
    else {
      (in_RDI->read_index_).super___atomic_base<int>._M_i = local_3c;
    }
    local_4c = local_70;
  }
  return local_4c;
}

Assistant:

int dequeue(T * elements, int count)
  {
#ifndef NDEBUG
    assert_correct_thread(consumer_id);
#endif

    int wr_idx = write_index_.load(std::memory_order_acquire);
    int rd_idx = read_index_.load(std::memory_order_relaxed);

    if (empty_internal(rd_idx, wr_idx)) {
      return 0;
    }

    int to_read = std::min(available_read_internal(rd_idx, wr_idx), count);

    int first_part = std::min(storage_capacity() - rd_idx, to_read);
    int second_part = to_read - first_part;

    if (elements) {
      Copy(elements, data_.get() + rd_idx, first_part);
      Copy(elements + first_part, data_.get(), second_part);
    }

    read_index_.store(increment_index(rd_idx, to_read),
                      std::memory_order_relaxed);

    return to_read;
  }